

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilIsop.c
# Opt level: O2

int Abc_IsopCountLits(Vec_Int_t *vCover,int nVars)

{
  int iVar1;
  int iVar2;
  byte bVar3;
  int iVar4;
  int i;
  bool bVar5;
  
  iVar1 = vCover->nSize;
  if (iVar1 != 0) {
    if ((iVar1 == 1) && (iVar1 = Vec_IntEntry(vCover,0), iVar1 == 0)) {
      return 0;
    }
    i = 0;
    if (nVars < 1) {
      nVars = i;
    }
    iVar1 = 0;
    for (; i < vCover->nSize; i = i + 1) {
      iVar2 = Vec_IntEntry(vCover,i);
      bVar3 = 0;
      iVar4 = nVars;
      while (bVar5 = iVar4 != 0, iVar4 = iVar4 + -1, bVar5) {
        switch(iVar2 >> (bVar3 & 0x1f) & 3) {
        case 0:
          goto switchD_00384d5f_caseD_0;
        default:
          iVar1 = iVar1 + 1;
switchD_00384d5f_caseD_0:
          bVar3 = bVar3 + 2;
          break;
        case 3:
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/utilIsop.c"
                        ,0x26e,"int Abc_IsopCountLits(Vec_Int_t *, int)");
        }
      }
    }
  }
  return iVar1;
}

Assistant:

int Abc_IsopCountLits( Vec_Int_t * vCover, int nVars )
{
    int i, k, Entry, Literal, nLits = 0;
    if ( Vec_IntSize(vCover) == 0 || (Vec_IntSize(vCover) == 1 && Vec_IntEntry(vCover, 0) == 0) )
        return 0;
    Vec_IntForEachEntry( vCover, Entry, i )
    { 
        for ( k = 0; k < nVars; k++ )
        {
            Literal = 3 & (Entry >> (k << 1));
            if ( Literal == 1 ) // neg literal
                nLits++;
            else if ( Literal == 2 ) // pos literal
                nLits++;
            else if ( Literal != 0 ) 
                assert( 0 );
        }
    }
    return nLits;
}